

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::startFunction(SymbolData *this,int64_t address)

{
  reference pvVar1;
  size_type sVar2;
  undefined1 local_28 [8];
  SymDataFunction func;
  int64_t address_local;
  SymbolData *this_local;
  
  func.size = address;
  if (this->currentFunction != -1) {
    endFunction(this,address);
  }
  pvVar1 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                     (&this->modules,(long)this->currentModule);
  sVar2 = std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::size(&pvVar1->functions);
  this->currentFunction = (int)sVar2;
  local_28 = (undefined1  [8])func.size;
  func.address = 0;
  pvVar1 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                     (&this->modules,(long)this->currentModule);
  std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::push_back
            (&pvVar1->functions,(value_type *)local_28);
  return;
}

Assistant:

void SymbolData::startFunction(int64_t address)
{
	if (currentFunction != -1)
	{
		endFunction(address);
	}

	currentFunction = (int)modules[currentModule].functions.size();

	SymDataFunction func;
	func.address = address;
	func.size = 0;
	modules[currentModule].functions.push_back(func);
}